

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void prune_partitions_after_split
               (AV1_COMP *cpi,MACROBLOCK *x,SIMPLE_MOTION_DATA_TREE *sms_tree,
               PartitionSearchState *part_search_state,RD_STATS *best_rdc,int64_t part_none_rd,
               int64_t part_split_rd)

{
  int iVar1;
  AV1_COMMON *cm_00;
  long in_RCX;
  long in_RDI;
  BLOCK_SIZE bsize;
  int mi_col;
  int mi_row;
  PartitionBlkParams blk_params;
  AV1_COMMON *cm;
  MACROBLOCK *in_stack_00000098;
  MACROBLOCK *in_stack_000000a8;
  AV1_COMP *in_stack_000000b0;
  PartitionSearchState *in_stack_000000b8;
  undefined1 local_64 [7];
  BLOCK_SIZE bsize_00;
  int in_stack_ffffffffffffffa4;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffffb0;
  MACROBLOCK *in_stack_ffffffffffffffb8;
  
  bsize_00 = (BLOCK_SIZE)((uint)stack0xffffffffffffffa0 >> 0x18);
  cm_00 = (AV1_COMMON *)(in_RDI + 0x3bf80);
  memcpy(local_64,(void *)(in_RCX + 8),0x2c);
  if (*(int *)(in_RDI + 0x60960) != 0) {
    iVar1 = frame_is_intra_only(cm_00);
    if ((((iVar1 == 0) && (*(int *)(in_RCX + 0x118) == 0)) && (*(int *)(in_RCX + 0x128) != 0)) &&
       ((*(int *)(in_RCX + 0x120) != 0 || (*(int *)(in_RCX + 0x124) != 0)))) {
      av1_ml_early_term_after_split
                ((AV1_COMP *)part_split_rd,in_stack_00000098,(SIMPLE_MOTION_DATA_TREE *)cpi,
                 (int64_t)x,(int64_t)sms_tree,(int64_t)part_search_state,
                 (int64_t *)in_stack_000000b0,in_stack_000000b8);
    }
  }
  if ((*(int *)(in_RDI + 0x60960) == 0) && (*(int *)(in_RDI + 0x6095c) != 0)) {
    iVar1 = frame_is_intra_only(cm_00);
    if ((iVar1 == 0) &&
       ((((*(int *)(in_RCX + 0x120) != 0 || (*(int *)(in_RCX + 0x124) != 0)) &&
         (*(int *)(in_RCX + 0x130) == 0)) &&
        ((*(int *)(in_RCX + 0x134) == 0 && (*(int *)(in_RCX + 0x118) == 0)))))) {
      av1_num_planes(cm_00);
      av1_setup_src_planes
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                 in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa4,bsize_00);
      av1_ml_prune_rect_partition
                (in_stack_000000b0,in_stack_000000a8,part_split_rd,(int64_t)in_stack_00000098,
                 (int64_t *)cpi,(PartitionSearchState *)x);
    }
  }
  return;
}

Assistant:

static void prune_partitions_after_split(
    AV1_COMP *const cpi, MACROBLOCK *x, SIMPLE_MOTION_DATA_TREE *sms_tree,
    PartitionSearchState *part_search_state, RD_STATS *best_rdc,
    int64_t part_none_rd, int64_t part_split_rd) {
  const AV1_COMMON *const cm = &cpi->common;
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  const int mi_row = blk_params.mi_row;
  const int mi_col = blk_params.mi_col;
  const BLOCK_SIZE bsize = blk_params.bsize;
  assert(bsize < BLOCK_SIZES_ALL);

  // Early termination: using the rd costs of PARTITION_NONE and subblocks
  // from PARTITION_SPLIT to determine an early breakout.
  if (cpi->sf.part_sf.ml_early_term_after_part_split_level &&
      !frame_is_intra_only(cm) &&
      !part_search_state->terminate_partition_search &&
      part_search_state->do_rectangular_split &&
      (part_search_state->partition_rect_allowed[HORZ] ||
       part_search_state->partition_rect_allowed[VERT])) {
    av1_ml_early_term_after_split(
        cpi, x, sms_tree, best_rdc->rdcost, part_none_rd, part_split_rd,
        part_search_state->split_rd, part_search_state);
  }

  // Use the rd costs of PARTITION_NONE and subblocks from PARTITION_SPLIT
  // to prune out rectangular partitions in some directions.
  if (!cpi->sf.part_sf.ml_early_term_after_part_split_level &&
      cpi->sf.part_sf.ml_prune_partition && !frame_is_intra_only(cm) &&
      (part_search_state->partition_rect_allowed[HORZ] ||
       part_search_state->partition_rect_allowed[VERT]) &&
      !(part_search_state->prune_rect_part[HORZ] ||
        part_search_state->prune_rect_part[VERT]) &&
      !part_search_state->terminate_partition_search) {
    av1_setup_src_planes(x, cpi->source, mi_row, mi_col, av1_num_planes(cm),
                         bsize);
    av1_ml_prune_rect_partition(cpi, x, best_rdc->rdcost,
                                part_search_state->none_rd,
                                part_search_state->split_rd, part_search_state);
  }
}